

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O3

void AppendRenderTimes(FString *str)

{
  FString::AppendFormat
            (str,
             "W: Render=%2.3f, Setup=%2.3f, Clip=%2.3f\nF: Render=%2.3f, Setup=%2.3f\nS: Render=%2.3f, Setup=%2.3f\nAll=%2.3f, Render=%2.3f, Setup=%2.3f, BSP = %2.3f, Portal=%2.3f, Drawcalls=%2.3f, Finish=%2.3f\n"
             ,(double)RenderWall.Counter * gl_MillisecPerCycle,
             (double)SetupWall.Counter * gl_MillisecPerCycle,
             (double)ClipWall.Counter * gl_MillisecPerCycle -
             (double)SetupWall.Counter * gl_MillisecPerCycle,
             (double)RenderFlat.Counter * gl_MillisecPerCycle,
             (double)SetupFlat.Counter * gl_MillisecPerCycle,
             (double)RenderSprite.Counter * gl_MillisecPerCycle,
             (double)SetupSprite.Counter * gl_MillisecPerCycle,
             (double)All.Counter * gl_MillisecPerCycle +
             (double)Finish.Counter * gl_MillisecPerCycle);
  return;
}

Assistant:

static void AppendRenderTimes(FString &str)
{
	double setupwall = SetupWall.TimeMS();
	double clipwall = ClipWall.TimeMS() - SetupWall.TimeMS();
	double bsp = Bsp.TimeMS() - ClipWall.TimeMS() - SetupFlat.TimeMS() - SetupSprite.TimeMS();

	str.AppendFormat("W: Render=%2.3f, Setup=%2.3f, Clip=%2.3f\n"
		"F: Render=%2.3f, Setup=%2.3f\n"
		"S: Render=%2.3f, Setup=%2.3f\n"
		"All=%2.3f, Render=%2.3f, Setup=%2.3f, BSP = %2.3f, Portal=%2.3f, Drawcalls=%2.3f, Finish=%2.3f\n",
	RenderWall.TimeMS(), setupwall, clipwall, RenderFlat.TimeMS(), SetupFlat.TimeMS(),
	RenderSprite.TimeMS(), SetupSprite.TimeMS(), All.TimeMS() + Finish.TimeMS(), RenderAll.TimeMS(),
	ProcessAll.TimeMS(), bsp, PortalAll.TimeMS(), drawcalls.TimeMS(), Finish.TimeMS());
}